

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall Clasp::Asp::SccChecker::visitDfs(SccChecker *this,PrgNode *node,NodeType t)

{
  undefined4 id;
  bool bVar1;
  uint32 uVar2;
  reference pCVar3;
  PrgAtom *this_00;
  reference puVar4;
  PrgAtom *this_01;
  pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_> *in_RDI;
  PrgNode *succVertex;
  Call c;
  Call *in_stack_00000080;
  SccChecker *in_stack_00000088;
  PrgNode *in_stack_ffffffffffffffa8;
  SccChecker *in_stack_ffffffffffffffb0;
  uintp n;
  undefined4 in_stack_ffffffffffffffb8;
  uint32 in_stack_ffffffffffffffbc;
  uint uVar5;
  PrgNode *in_stack_ffffffffffffffc8;
  SccChecker *in_stack_ffffffffffffffd0;
  uint32 local_20;
  
  if ((in_RDI[2].ebo_.buf != (pointer)0x0) &&
     (bVar1 = doVisit(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,false), bVar1)) {
    bk_lib::pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>
    ::clear(in_RDI);
    bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
    *(undefined4 *)&in_RDI[3].ebo_.buf = 0;
    addCall(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(NodeType)((ulong)in_RDI >> 0x20),
            (uint32)in_RDI,in_stack_ffffffffffffffbc);
    while (bVar1 = bk_lib::
                   pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>
                   ::empty(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      pCVar3 = bk_lib::
               pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>
               ::back(in_RDI);
      n = pCVar3->node;
      id = pCVar3->min;
      bk_lib::
      pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>::
      pop_back(in_RDI);
      bVar1 = recurse(in_stack_00000088,in_stack_00000080);
      if (!bVar1) {
        this_00 = (PrgAtom *)unpackNode(n);
        uVar5 = id;
        uVar2 = PrgNode::id((PrgNode *)this_00);
        if (uVar5 < uVar2) {
          PrgNode::resetId((PrgNode *)this_00,id,true);
        }
        else {
          puVar4 = bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 1));
          if (n == *puVar4) {
            puVar4 = bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                               ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 1));
            bVar1 = isNode(*puVar4,Atom);
            if (bVar1) {
              PrgAtom::setScc(this_00,0x7ffffff);
            }
            PrgNode::resetId((PrgNode *)this_00,0xfffffff,true);
            bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                      ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
          }
          else {
            do {
              puVar4 = bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                 ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  (in_RDI + 1));
              this_01 = (PrgAtom *)unpackNode(*puVar4);
              puVar4 = bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                 ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  (in_RDI + 1));
              bVar1 = isNode(*puVar4,Atom);
              if (bVar1) {
                PrgAtom::setScc(this_01,*(uint32 *)((long)&in_RDI[3].ebo_.buf + 4));
                bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::
                push_back((pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>
                           *)in_RDI,(PrgAtom **)CONCAT44(uVar5,in_stack_ffffffffffffffb8));
              }
              bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                        ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
              PrgNode::resetId((PrgNode *)this_01,0xfffffff,true);
            } while (this_01 != this_00);
            *(int *)((long)&in_RDI[3].ebo_.buf + 4) = *(int *)((long)&in_RDI[3].ebo_.buf + 4) + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SccChecker::visitDfs(PrgNode* node, NodeType t) {
	if (!prg_ || !doVisit(node)) {
		return;
	}
	callStack_.clear();
	nodeStack_.clear();
	count_ = 0;
	addCall(node, t, 0);
	while (!callStack_.empty()) {
		Call c = callStack_.back();
		callStack_.pop_back();
		if (!recurse(c)) {
			node = unpackNode(c.node);
			if (c.min < node->id()) {
				node->resetId( c.min, true );
			}
			else if (c.node == nodeStack_.back()) {
				// node is trivially-connected; all such nodes are in the same Pseudo-SCC
				if (isNode(nodeStack_.back(), PrgNode::Atom)) {
					static_cast<PrgAtom*>(node)->setScc(PrgNode::noScc);
				}
				node->resetId(PrgNode::noNode, true);
				nodeStack_.pop_back();
			}
			else { // non-trivial SCC
				PrgNode* succVertex;
				do {
					succVertex = unpackNode(nodeStack_.back());
					if (isNode(nodeStack_.back(), PrgNode::Atom)) {
						static_cast<PrgAtom*>(succVertex)->setScc(sccs_);
						sccAtoms_->push_back(static_cast<PrgAtom*>(succVertex));
					}
					nodeStack_.pop_back();
					succVertex->resetId(PrgNode::noNode, true);
				} while (succVertex != node);
				++sccs_;
			}
		}
	}
}